

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableCallWorks_Test::~SemanticAnalyserTest_VariableCallWorks_Test
          (SemanticAnalyserTest_VariableCallWorks_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableCallWorks_Test
            ((SemanticAnalyserTest_VariableCallWorks_Test *)0x1e94d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableCallWorks)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    let x: function = print;
    print("test");
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}